

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

void push_witness_stack(uchar **cursor,size_t *max,wally_tx_witness_stack *witness)

{
  long lVar1;
  ulong uVar2;
  
  push_varint(cursor,max,witness->num_items);
  if (witness->num_items != 0) {
    lVar1 = 8;
    uVar2 = 0;
    do {
      push_varbuff(cursor,max,*(uchar **)((long)witness->items + lVar1 + -8),
                   *(size_t *)((long)&witness->items->witness + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < witness->num_items);
  }
  return;
}

Assistant:

static void push_witness_stack(unsigned char **cursor, size_t *max,
                               const struct wally_tx_witness_stack *witness)
{
    size_t i;

    push_varint(cursor, max, witness->num_items);
    for (i = 0; i < witness->num_items; ++i) {
        push_varbuff(cursor, max, witness->items[i].witness,
                     witness->items[i].witness_len);
    }
}